

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O2

TIntermTyped * __thiscall
glslang::TIntermediate::addUniShapeConversion
          (TIntermediate *this,TOperator op,TType *type,TIntermTyped *node)

{
  uint uVar1;
  int iVar2;
  TIntermTyped *pTVar3;
  
  if (this->source == EShSourceHlsl) {
    uVar1 = op - EOpAssign;
    if (uVar1 < 0xf) {
      if ((0x7d0eU >> (uVar1 & 0x1f) & 1) != 0) {
        iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x26])(node);
        if (iVar2 == 1) {
          return node;
        }
        goto LAB_004023f6;
      }
      if (uVar1 == 0) goto LAB_004023f6;
    }
    if (((op == EOpFunctionCall) || (op == EOpMix)) || (op == EOpReturn)) {
LAB_004023f6:
      pTVar3 = addShapeConversion(this,type,node);
      return pTVar3;
    }
  }
  return node;
}

Assistant:

TIntermTyped* TIntermediate::addUniShapeConversion(TOperator op, const TType& type, TIntermTyped* node)
{
    // some source languages don't do this
    switch (getSource()) {
    case EShSourceHlsl:
        break;
    case EShSourceGlsl:
    default:
        return node;
    }

    // some operations don't do this
    switch (op) {
    case EOpFunctionCall:
    case EOpReturn:
        break;

    case EOpMulAssign:
        // want to support vector *= scalar native ops in AST and lower, not smear, similarly for
        // matrix *= scalar, etc.

    case EOpAddAssign:
    case EOpSubAssign:
    case EOpDivAssign:
    case EOpAndAssign:
    case EOpInclusiveOrAssign:
    case EOpExclusiveOrAssign:
    case EOpRightShiftAssign:
    case EOpLeftShiftAssign:
        if (node->getVectorSize() == 1)
            return node;
        break;

    case EOpAssign:
        break;

    case EOpMix:
        break;

    default:
        return node;
    }

    return addShapeConversion(type, node);
}